

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSceneObjectTypesFilterInfoMSFT *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  NextChainResult NVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  XrResult XVar8;
  string local_2b0;
  GenValidUsageXrInstanceInfo *local_290;
  string *local_288;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_280;
  string local_278;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_240;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  string error_message;
  ios_base local_170 [264];
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  
  XVar8 = XR_SUCCESS;
  local_290 = instance_info;
  local_288 = command_name;
  local_280 = objects_info;
  if (value->type != XR_TYPE_SCENE_OBJECT_TYPES_FILTER_INFO_MSFT) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSceneObjectTypesFilterInfoMSFT",
               value->type,"VUID-XrSceneObjectTypesFilterInfoMSFT-type-type",
               XR_TYPE_SCENE_OBJECT_TYPES_FILTER_INFO_MSFT,
               "XR_TYPE_SCENE_OBJECT_TYPES_FILTER_INFO_MSFT");
    XVar8 = XR_ERROR_VALIDATION_FAILURE;
  }
  if (!check_pnext) goto LAB_001a0c96;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  NVar4 = ValidateNextChain(local_290,local_288,local_280,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar4 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ","");
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_2b0,local_290,&duplicate_ext_structs);
    std::__cxx11::string::_M_append((char *)&error_message,(ulong)local_2b0._M_dataplus._M_p);
    paVar1 = &local_2b0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,"VUID-XrSceneObjectTypesFilterInfoMSFT-next-unique","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_210,local_280);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,
               "Multiple structures of the same type(s) in \"next\" chain for XrSceneObjectTypesFilterInfoMSFT struct"
               ,"");
    CoreValidLogMessage(local_290,&local_2b0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_288,&local_210,
                        &local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_210.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_210.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_210.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_210.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      uVar7 = local_2b0.field_2._M_allocated_capacity + 1;
      local_1f8.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_2b0._M_dataplus._M_p;
LAB_001a0c57:
      operator_delete(local_1f8.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,uVar7);
    }
LAB_001a0c5c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_message._M_dataplus._M_p != &error_message.field_2) {
      operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1
                     );
    }
    XVar8 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar4 == NEXT_CHAIN_RESULT_ERROR) {
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,"VUID-XrSceneObjectTypesFilterInfoMSFT-next-next","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1f8,local_280);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,
               "Invalid structure(s) in \"next\" chain for XrSceneObjectTypesFilterInfoMSFT struct \"next\""
               ,"");
    CoreValidLogMessage(local_290,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_288,
                        &local_1f8,&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      uVar7 = (long)local_1f8.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)local_1f8.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_001a0c57;
    }
    goto LAB_001a0c5c;
  }
  if (duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(duplicate_ext_structs.
                    super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)duplicate_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)duplicate_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_001a0c96:
  if (check_members && XVar8 == XR_SUCCESS) {
    if (value->objectTypeCount != 0) {
      paVar1 = &error_message.field_2;
      if (value->objectTypes == (XrSceneObjectTypeMSFT *)0x0) {
        error_message._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&error_message,
                   "VUID-XrSceneObjectTypesFilterInfoMSFT-objectTypes-parameter","");
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_228,local_280);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2b0,
                   "Structure XrSceneObjectTypesFilterInfoMSFT member objectTypeCount is NULL, but value->objectTypeCount is greater than 0"
                   ,"");
        CoreValidLogMessage(local_290,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_288,
                            &local_228,&local_2b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if (local_228.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_228.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_228.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_228.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)error_message._M_dataplus._M_p != paVar1) {
          operator_delete(error_message._M_dataplus._M_p,
                          error_message.field_2._M_allocated_capacity + 1);
        }
        return XR_ERROR_VALIDATION_FAILURE;
      }
      uVar7 = 0;
      do {
        error_message._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&error_message,"XrSceneObjectTypesFilterInfoMSFT","");
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"objectTypes","");
        bVar3 = ValidateXrEnum(local_290,local_288,&error_message,&local_2b0,local_280,
                               value->objectTypes[uVar7]);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)error_message._M_dataplus._M_p != paVar1) {
          operator_delete(error_message._M_dataplus._M_p,
                          error_message.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&error_message,
                     "XrSceneObjectTypesFilterInfoMSFT contains invalid XrSceneObjectTypeMSFT \"objectTypes\" enum value "
                     ,0x61);
          local_278._M_dataplus._M_p._0_4_ = value->objectTypes[uVar7];
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_2b0,'\n');
          *local_2b0._M_dataplus._M_p = '0';
          local_2b0._M_dataplus._M_p[1] = 'x';
          pcVar5 = local_2b0._M_dataplus._M_p + (local_2b0._M_string_length - 1);
          lVar6 = 0;
          do {
            bVar2 = *(byte *)((long)&local_278._M_dataplus._M_p + lVar6);
            *pcVar5 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
            pcVar5[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
            lVar6 = lVar6 + 1;
            pcVar5 = pcVar5 + -2;
          } while (lVar6 != 4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&error_message,local_2b0._M_dataplus._M_p,local_2b0._M_string_length
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2b0,
                     "VUID-XrSceneObjectTypesFilterInfoMSFT-objectTypes-parameter","");
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_240,local_280);
          std::__cxx11::stringbuf::str();
          CoreValidLogMessage(local_290,&local_2b0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_288,
                              &local_240,&local_278);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if (local_240.
              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_240.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_240.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_240.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
          std::ios_base::~ios_base(local_170);
          return XR_ERROR_VALIDATION_FAILURE;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < value->objectTypeCount);
    }
    XVar8 = XR_SUCCESS;
  }
  return XVar8;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSceneObjectTypesFilterInfoMSFT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SCENE_OBJECT_TYPES_FILTER_INFO_MSFT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSceneObjectTypesFilterInfoMSFT",
                             value->type, "VUID-XrSceneObjectTypesFilterInfoMSFT-type-type", XR_TYPE_SCENE_OBJECT_TYPES_FILTER_INFO_MSFT, "XR_TYPE_SCENE_OBJECT_TYPES_FILTER_INFO_MSFT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSceneObjectTypesFilterInfoMSFT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSceneObjectTypesFilterInfoMSFT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSceneObjectTypesFilterInfoMSFT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSceneObjectTypesFilterInfoMSFT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSceneObjectTypesFilterInfoMSFT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Optional array must be non-NULL when value->objectTypeCount is non-zero
    if (0 != value->objectTypeCount && nullptr == value->objectTypes) {
        CoreValidLogMessage(instance_info, "VUID-XrSceneObjectTypesFilterInfoMSFT-objectTypes-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSceneObjectTypesFilterInfoMSFT member objectTypeCount is NULL, but value->objectTypeCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->objectTypes) {
        for (uint32_t value_objecttypes_inc = 0; value_objecttypes_inc < value->objectTypeCount; ++value_objecttypes_inc) {
            // Make sure the enum type XrSceneObjectTypeMSFT value is valid
            if (!ValidateXrEnum(instance_info, command_name, "XrSceneObjectTypesFilterInfoMSFT", "objectTypes", objects_info, value->objectTypes[value_objecttypes_inc])) {
                std::ostringstream oss_enum;
                oss_enum << "XrSceneObjectTypesFilterInfoMSFT contains invalid XrSceneObjectTypeMSFT \"objectTypes\" enum value ";
                oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->objectTypes[value_objecttypes_inc]));
                CoreValidLogMessage(instance_info, "VUID-XrSceneObjectTypesFilterInfoMSFT-objectTypes-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, oss_enum.str());
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}